

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O2

void __thiscall HFactor::clinkDel(HFactor *this,int index)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  int *piVar6;
  
  piVar3 = (this->clinkLast).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[index];
  lVar5 = (long)iVar1;
  piVar4 = (this->clinkNext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar4[index];
  piVar6 = piVar4 + lVar5;
  if (lVar5 < 0) {
    piVar6 = (this->clinkFirst).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + (-2 - lVar5);
  }
  *piVar6 = iVar2;
  if (-1 < (long)iVar2) {
    piVar3[iVar2] = iVar1;
  }
  return;
}

Assistant:

void clinkDel(const int index) {
        const int xlast = clinkLast[index];
        const int xnext = clinkNext[index];
        if (xlast >= 0)
            clinkNext[xlast] = xnext;
        else
            clinkFirst[-xlast - 2] = xnext;
        if (xnext >= 0)
            clinkLast[xnext] = xlast;
    }